

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::TestSpec::Filter::matches(Filter *this,TestCaseInfo *testCase)

{
  pointer psVar1;
  element_type *peVar2;
  int iVar3;
  long lVar4;
  pointer psVar5;
  pointer psVar6;
  long lVar7;
  
  psVar6 = (this->m_patterns).
           super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_patterns).
           super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)psVar1 - (long)psVar6;
  if (0 < lVar7 >> 6) {
    lVar4 = (lVar7 >> 6) + 1;
    psVar6 = psVar6 + 2;
    do {
      psVar5 = psVar6;
      peVar2 = psVar5[-2].super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
      if ((char)iVar3 == '\0') {
        psVar5 = psVar5 + -2;
        goto LAB_00126f73;
      }
      peVar2 = psVar5[-1].super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
      if ((char)iVar3 == '\0') {
        psVar5 = psVar5 + -1;
        goto LAB_00126f73;
      }
      peVar2 = (psVar5->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
      if ((char)iVar3 == '\0') goto LAB_00126f73;
      peVar2 = psVar5[1].super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
      if ((char)iVar3 == '\0') {
        psVar5 = psVar5 + 1;
        goto LAB_00126f73;
      }
      lVar4 = lVar4 + -1;
      lVar7 = lVar7 + -0x40;
      psVar6 = psVar5 + 4;
    } while (1 < lVar4);
    psVar6 = psVar5 + 2;
  }
  lVar7 = lVar7 >> 4;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      psVar5 = psVar1;
      if ((lVar7 != 3) ||
         (peVar2 = (psVar6->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr, iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase), psVar5 = psVar6,
         (char)iVar3 == '\0')) goto LAB_00126f73;
      psVar6 = psVar6 + 1;
    }
    peVar2 = (psVar6->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
    psVar5 = psVar6;
    if ((char)iVar3 == '\0') goto LAB_00126f73;
    psVar6 = psVar6 + 1;
  }
  peVar2 = (psVar6->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  iVar3 = (*peVar2->_vptr_Pattern[2])(peVar2,testCase);
  psVar5 = psVar6;
  if ((char)iVar3 != '\0') {
    psVar5 = psVar1;
  }
LAB_00126f73:
  return psVar5 == psVar1;
}

Assistant:

bool TestSpec::Filter::matches( TestCaseInfo const& testCase ) const {
        return std::all_of( m_patterns.begin(), m_patterns.end(), [&]( PatternPtr const& p ){ return p->matches( testCase ); } );
    }